

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O1

double __thiscall
Alg::max_cover_lazy_budget
          (Alg *this,Graph *graph,double budget,vector<double,_std::allocator<double>_> *budget_list
          ,double *timeb,int mode)

{
  pointer *pppVar1;
  vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>> *this_00;
  size_t sVar2;
  iterator iVar3;
  pointer pvVar4;
  pointer pdVar5;
  iterator iVar6;
  double dVar7;
  pointer pvVar8;
  ulong *puVar9;
  pointer pvVar10;
  void *pvVar11;
  pointer puVar12;
  double *pdVar13;
  pointer pvVar14;
  uint uVar15;
  ulong uVar16;
  ostream *poVar17;
  double *pdVar18;
  long extraout_RAX;
  long extraout_RAX_00;
  long extraout_RAX_01;
  pointer puVar19;
  uint *puVar20;
  ulong *puVar21;
  long extraout_RAX_02;
  long extraout_RAX_03;
  long extraout_RAX_04;
  int iVar22;
  pair<unsigned_long,_double> *ppVar23;
  pointer ppVar24;
  uint *puVar25;
  double *pdVar26;
  pointer ppVar27;
  pointer *ppuVar28;
  undefined1 auVar29 [8];
  __normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
  __i_1;
  long lVar30;
  pair<unsigned_long,_double> *ppVar31;
  pointer ppVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  char cVar37;
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar38;
  __normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
  __i;
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar39;
  _Bit_type *p_Var40;
  ulong uVar41;
  Alg *pAVar42;
  bool bVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  double dVar47;
  double dVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  double dVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  Nodelist vecBound_1;
  vector<bool,_std::allocator<bool>_> edgeMark_cost;
  vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
  degMap_cost;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  miss_nodes_vec;
  vector<bool,_std::allocator<bool>_> node_sel_cost;
  vector<double,_std::allocator<double>_> coverage_cost;
  vector<bool,_std::allocator<bool>_> edgeMark;
  vector<bool,_std::allocator<bool>_> node_sel;
  FRset coverage;
  RRsets degMap;
  uint local_244;
  double local_240;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_238;
  undefined8 local_218;
  undefined8 uStack_210;
  uint local_1fc;
  vector<double,_std::allocator<double>_> *local_1f8;
  Alg *local_1f0;
  ulong local_1e8;
  double local_1e0;
  uint *local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [8];
  _Bit_type *p_Stack_1c0;
  _Bit_type *local_1b8;
  uint local_1b0;
  _Bit_pointer local_1a8;
  ulong local_198;
  vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
  local_190;
  double local_178;
  undefined8 uStack_170;
  long local_160;
  double local_158;
  int local_14c;
  pair<unsigned_long,_double> *local_148;
  iterator iStack_140;
  pair<unsigned_long,_double> *local_138;
  vector<bool,_std::allocator<bool>_> local_128;
  vector<double,_std::allocator<double>_> local_100;
  vector<bool,_std::allocator<bool>_> local_e8;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_c0;
  vector<bool,_std::allocator<bool>_> local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  double local_78;
  double local_70;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_68;
  Nodelist *local_50;
  double *local_48;
  long local_40;
  pointer local_38;
  
  this->__boundLast = 1.79769313486232e+308;
  this->__boundMin = 1.79769313486232e+308;
  this->__boundLast_inf = 1.79769313486232e+308;
  this->__boundMin_inf = 1.79769313486232e+308;
  this->__boundLast_inf_cost = 1.79769313486232e+308;
  this->__boundMin_inf_cost = 1.79769313486232e+308;
  local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_240 = budget;
  local_1f8 = budget_list;
  local_14c = mode;
  local_48 = timeb;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_90,(ulong)this->__numV,(value_type_conflict2 *)&local_e8,
             (allocator_type *)&local_b8);
  uVar16 = (ulong)this->__numV;
  if (uVar16 == 0) {
    uVar41 = 0;
  }
  else {
    ppuVar28 = (pointer *)
               ((long)&(this->__hyperG)._FRsets.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16 - 1].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data + 8);
    uVar41 = 0;
    do {
      uVar33 = (long)*ppuVar28 - (long)((_Vector_impl_data *)(ppuVar28 + -1))->_M_start >> 3;
      if (uVar41 < uVar33) {
        uVar41 = uVar33;
      }
      ppuVar28 = ppuVar28 + -3;
      local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar16 - 1] = uVar33;
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
  }
  local_1f0 = this;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_68,uVar41 + 1,(allocator_type *)&local_e8);
  uVar15 = local_1f0->__numV - 1;
  local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT44(local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p._4_4_,uVar15);
  if (local_1f0->__numV != 0) {
    do {
      if (local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar15] != 0) {
        pvVar38 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                  (local_68.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                  local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar15]);
        iVar3._M_current = *(uint **)(pvVar38 + 8);
        if (iVar3._M_current == *(uint **)(pvVar38 + 0x10)) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(pvVar38,iVar3,(uint *)&local_e8);
        }
        else {
          *iVar3._M_current = uVar15;
          *(uint **)(pvVar38 + 8) = iVar3._M_current + 1;
        }
      }
      bVar43 = (int)local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != 0;
      uVar15 = (int)local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p - 1;
      local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p =
           (_Bit_type *)
           CONCAT44(local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,uVar15);
    } while (bVar43);
  }
  pAVar42 = local_1f0;
  local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       ((ulong)local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_e8,local_1f0->__numRRsets,(bool *)&local_b8,(allocator_type *)local_1c8);
  local_1c8 = (undefined1  [8])((ulong)local_1c8 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_b8,(ulong)pAVar42->__numV,(bool *)local_1c8,(allocator_type *)&local_128);
  local_1e0 = min_vector_nonzero_mask(local_1f8,&local_b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"min_cost: ",10);
  poVar17 = std::ostream::_M_insert<double>(local_1e0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  puVar19 = (local_1f0->__vecSeed_inf).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((local_1f0->__vecSeed_inf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar19) {
    (local_1f0->__vecSeed_inf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar19;
  }
  local_218 = 0.0;
  if ((local_1e0 <= local_240) && (uVar41 != 0)) {
    local_c0 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&local_1f0->__vecSeed_inf;
    local_218 = 0.0;
    iVar22 = 0;
    while( true ) {
      lVar30 = (long)local_68.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar41].
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_68.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar41].
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (lVar30 != 0) {
        pvVar10 = local_68.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar41;
        lVar30 = lVar30 >> 2;
        local_178 = (double)(uVar41 * 3);
        do {
          uVar15 = (pvVar10->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start[lVar30 + -1];
          lVar30 = lVar30 + -1;
          local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p =
               (_Bit_type *)
               CONCAT44(local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,uVar15
                       );
          if (local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar15] < uVar41) {
            pvVar38 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                      (local_68.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                      local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar15]);
            iVar3._M_current = *(uint **)(pvVar38 + 8);
            if (iVar3._M_current == *(uint **)(pvVar38 + 0x10)) {
              cVar37 = '\n';
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(pvVar38,iVar3,(uint *)&local_128);
            }
            else {
              *iVar3._M_current = uVar15;
              *(uint **)(pvVar38 + 8) = iVar3._M_current + 1;
              cVar37 = '\n';
            }
          }
          else {
            if ((local_1f8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar15] <= local_240) {
              if (local_14c == 2) {
                local_1c8 = (undefined1  [8])0x0;
                p_Stack_1c0 = (_Bit_type *)0x0;
                local_1b8 = (_Bit_type *)0x0;
                local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_ =
                     (undefined4)
                     local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start
                     [(&((local_68.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start)[(long)local_178][lVar30]];
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,
                           (iterator)0x0,(uint *)&local_100);
                lVar36 = 0;
                for (auVar29 = local_1c8; auVar29 != (undefined1  [8])p_Stack_1c0;
                    auVar29 = (undefined1  [8])((long)auVar29 + 4)) {
                  lVar36 = lVar36 + (ulong)(uint)*(_Bit_type *)auVar29;
                }
                lVar36 = lVar36 + (long)local_218;
                auVar44._8_4_ = (int)((ulong)lVar36 >> 0x20);
                auVar44._0_8_ = lVar36;
                auVar44._12_4_ = 0x45300000;
                sVar2 = local_1f0->__numRRsets;
                auVar49._8_4_ = (int)(sVar2 >> 0x20);
                auVar49._0_8_ = sVar2;
                auVar49._12_4_ = 0x45300000;
                dVar51 = ((double)local_1f0->__numV *
                         ((auVar44._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar36) - 4503599627370496.0))) /
                         ((auVar49._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
                local_1f0->__boundLast_inf = dVar51;
                if (dVar51 < local_1f0->__boundMin_inf) {
                  local_1f0->__boundMin_inf = dVar51;
                }
                if (local_1c8 != (undefined1  [8])0x0) {
                  operator_delete((void *)local_1c8,(long)local_1b8 - (long)local_1c8);
                }
              }
              if (iVar22 == 0) {
                local_218 = (double)((long)local_218 +
                                    local_90.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start
                                    [(ulong)local_128.super__Bvector_base<std::allocator<bool>_>.
                                            _M_impl.super__Bvector_impl_data._M_start.
                                            super__Bit_iterator_base._M_p & 0xffffffff]);
                iVar3._M_current =
                     (local_1f0->__vecSeed_inf).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar3._M_current ==
                    (local_1f0->__vecSeed_inf).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>(local_c0,iVar3,(uint *)&local_128);
                }
                else {
                  *iVar3._M_current =
                       (uint)local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                  (local_1f0->__vecSeed_inf).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                }
                uVar16 = (ulong)local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p &
                         0xffffffff;
                local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar16] = 0;
                pvVar8 = (local_1f0->__hyperG)._FRsets.
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar21 = pvVar8[uVar16].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start;
                puVar9 = *(pointer *)
                          ((long)&pvVar8[uVar16].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data + 8);
                if (puVar21 != puVar9) {
                  pvVar4 = (local_1f0->__hyperG)._RRsets.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  do {
                    uVar16 = *puVar21;
                    uVar33 = uVar16 + 0x3f;
                    if (-1 < (long)uVar16) {
                      uVar33 = uVar16;
                    }
                    uVar35 = (ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001);
                    if ((local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [((long)uVar33 >> 6) + (uVar35 - 1)] >> (uVar16 & 0x3f) & 1) == 0) {
                      local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                      [((long)uVar33 >> 6) + (uVar35 - 1)] =
                           local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [((long)uVar33 >> 6) + (uVar35 - 1)] | 1L << ((byte)uVar16 & 0x3f);
                      puVar20 = *(pointer *)
                                 ((long)&pvVar4[uVar16].
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data + 8);
                      for (puVar25 = pvVar4[uVar16].
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start; puVar25 != puVar20;
                          puVar25 = puVar25 + 1) {
                        if (local_90.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[*puVar25] != 0) {
                          local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start[*puVar25] =
                               local_90.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[*puVar25] - 1;
                        }
                      }
                    }
                    puVar21 = puVar21 + 1;
                  } while (puVar21 != puVar9);
                }
              }
              iVar22 = iVar22 + 1;
            }
            cVar37 = (iVar22 == 2) * '\t';
          }
        } while (((cVar37 == '\n') || (cVar37 == '\0')) && (lVar30 != 0));
      }
      if (iVar22 == 2) break;
      puVar19 = local_68.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      pvVar10 = local_68.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1;
      if (puVar19 != (pointer)0x0) {
        pvVar10 = local_68.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1;
        local_68.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_68.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
        operator_delete(puVar19,(long)(pvVar10->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)puVar19);
        pvVar10 = local_68.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      local_68.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pvVar10;
      if ((local_240 < local_1e0) || (uVar41 = uVar41 - 1, uVar41 == 0)) break;
    }
  }
  pAVar42 = local_1f0;
  uVar15 = local_1f0->__numV;
  local_178 = (double)local_1f0->__numRRsets;
  uStack_170 = 0;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  >>>[greedy-lazy] influence: ",0x1e);
  poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
  auVar52._8_4_ = (int)((ulong)local_218 >> 0x20);
  auVar52._0_8_ = local_218;
  auVar52._12_4_ = 0x45300000;
  auVar53._8_4_ = (int)((ulong)local_178 >> 0x20);
  auVar53._0_8_ = local_178;
  auVar53._12_4_ = 0x45300000;
  local_78 = ((double)uVar15 *
             ((auVar52._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,SUB84(local_218,0)) - 4503599627370496.0))) /
             ((auVar53._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,SUB84(local_178,0)) - 4503599627370496.0));
  poVar17 = std::ostream::_M_insert<double>(local_78);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,", min-bound: ",0xd);
  poVar17 = std::ostream::_M_insert<double>(pAVar42->__boundMin_inf);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,", last-bound: ",0xe);
  poVar17 = std::ostream::_M_insert<double>(pAVar42->__boundLast_inf);
  local_1c8[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,local_1c8,1);
  local_1c8 = (undefined1  [8])0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_100,(ulong)pAVar42->__numV,(value_type_conflict4 *)local_1c8,
             (allocator_type *)&local_128);
  uVar16 = (ulong)pAVar42->__numV;
  if (uVar16 == 0) {
    uVar41 = 0;
  }
  else {
    pdVar5 = (local_1f8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    ppuVar28 = (pointer *)
               ((long)&(pAVar42->__hyperG)._FRsets.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16 - 1].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data + 8);
    uVar41 = uVar16;
    do {
      lVar30 = (long)*ppuVar28 - (long)((_Vector_impl_data *)(ppuVar28 + -1))->_M_start;
      lVar36 = lVar30 >> 3;
      dVar51 = pdVar5[uVar41 - 1];
      auVar54._8_4_ = (int)(lVar30 >> 0x23);
      auVar54._0_8_ = lVar36;
      auVar54._12_4_ = 0x45300000;
      uVar33 = 0;
      if (*ppuVar28 != ((_Vector_impl_data *)(ppuVar28 + -1))->_M_start) {
        uVar33 = ~-(ulong)(ABS(dVar51) <= 1e-10) &
                 (ulong)(((auVar54._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar36) - 4503599627370496.0)) / dVar51);
      }
      ppuVar28 = ppuVar28 + -3;
      *(ulong *)(CONCAT44(local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_) + -8 + uVar41 * 8) = uVar33;
      uVar41 = uVar41 - 1;
    } while (uVar41 != 0);
    uVar41 = 0;
    do {
      uVar33 = (ulong)((int)*(double *)
                             (CONCAT44(local_100.super__Vector_base<double,_std::allocator<double>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_100.super__Vector_base<double,_std::allocator<double>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + -8 +
                             uVar16 * 8) + 1);
      if (uVar33 < uVar41) {
        uVar33 = uVar41;
      }
      uVar41 = uVar33;
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"maxDeg: ",8);
  poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  std::
  vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
  ::vector(&local_190,uVar41 + 1,(allocator_type *)local_1c8);
  p_Var40 = (_Bit_type *)(ulong)pAVar42->__numV;
  if (p_Var40 != (_Bit_type *)0x0) {
    do {
      p_Var40 = (_Bit_type *)((long)p_Var40 - 1);
      dVar51 = *(double *)
                (CONCAT44(local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_) + (long)p_Var40 * 8);
      if (1e-10 < ABS(dVar51)) {
        iVar22 = (int)dVar51;
        p_Stack_1c0 = *(_Bit_type **)
                       (CONCAT44(local_100.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 local_100.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_4_) + (long)p_Var40 * 8
                       );
        iVar6._M_current =
             local_190.
             super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(long)iVar22 + 1].
             super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_1c8 = (undefined1  [8])p_Var40;
        if (iVar6._M_current ==
            local_190.
            super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[(long)iVar22 + 1].
            super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>::
          _M_realloc_insert<std::pair<unsigned_long,double>>
                    ((vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>
                      *)(local_190.
                         super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + (long)iVar22 + 1),iVar6,
                     (pair<unsigned_long,_double> *)local_1c8);
        }
        else {
          (iVar6._M_current)->first = (unsigned_long)p_Var40;
          (iVar6._M_current)->second = (double)p_Stack_1c0;
          pppVar1 = &local_190.
                     super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)iVar22 + 1].
                     super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pppVar1 = *pppVar1 + 1;
        }
      }
    } while (p_Var40 != (_Bit_type *)0x0);
  }
  local_148 = (pair<unsigned_long,_double> *)0x0;
  iStack_140._M_current = (pair<unsigned_long,_double> *)0x0;
  local_138 = (pair<unsigned_long,_double> *)0x0;
  local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       ((ulong)local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_1c8,pAVar42->__numRRsets,
             (bool *)&local_128,(allocator_type *)&local_238);
  local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_128,(ulong)pAVar42->__numV,(bool *)&local_238,(allocator_type *)&local_244);
  local_178 = min_vector_nonzero_mask(local_1f8,&local_128);
  std::chrono::_V2::system_clock::now();
  puVar19 = (pAVar42->__vecSeed_inf_cost).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((pAVar42->__vecSeed_inf_cost).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar19) {
    (pAVar42->__vecSeed_inf_cost).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar19;
  }
  local_198 = 0;
  if ((uVar41 != 0) && (local_178 <= local_240)) {
    local_50 = &pAVar42->__vecSeed_inf_cost;
    local_198 = 0;
    local_158 = 0.0;
    do {
      ppVar24 = local_190.
                super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar41].
                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar27 = local_190.
                super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar41].
                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      local_1e8 = uVar41;
      if (ppVar24 != ppVar27) {
        uVar16 = (long)ppVar27 - (long)ppVar24 >> 4;
        lVar30 = 0x3f;
        if (uVar16 != 0) {
          for (; uVar16 >> lVar30 == 0; lVar30 = lVar30 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__0>>
                  (ppVar24,ppVar27,((uint)lVar30 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)ppVar27 - (long)ppVar24 < 0x101) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__0>>
                    (ppVar24,ppVar27);
          pAVar42 = local_1f0;
        }
        else {
          ppVar32 = ppVar24 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__0>>
                    (ppVar24,ppVar32);
          pAVar42 = local_1f0;
          if (ppVar32 != ppVar27) {
            pdVar18 = &ppVar24[0x10].second;
            do {
              dVar48 = (double)ppVar32->first;
              dVar51 = ppVar32->second;
              dVar47 = ppVar32[-1].second;
              ppVar24 = ppVar32;
              pdVar13 = pdVar18;
              if (dVar51 < dVar47) {
                do {
                  pdVar26 = pdVar13;
                  ((pair<unsigned_long,_double> *)(pdVar26 + -1))->first =
                       (unsigned_long)pdVar26[-3];
                  *pdVar26 = dVar47;
                  dVar47 = pdVar26[-4];
                  pdVar13 = pdVar26 + -2;
                } while (dVar51 < dVar47);
                ppVar24 = (pointer)(pdVar26 + -3);
              }
              ppVar24->first = (unsigned_long)dVar48;
              ppVar24->second = dVar51;
              ppVar32 = ppVar32 + 1;
              pdVar18 = pdVar18 + 2;
            } while (ppVar32 != ppVar27);
          }
        }
      }
      lVar30 = (long)local_190.
                     super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar41].
                     super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_190.
                     super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar41].
                     super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar16 = local_1e8;
      if (lVar30 != 0) {
        local_38 = local_190.
                   super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar41;
        pvVar38 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(lVar30 >> 4);
        local_1e0 = (double)(uVar41 * 3);
        do {
          local_c0 = pvVar38 + -1;
          puVar25 = (uint *)(local_38->
                            super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[(long)local_c0].first;
          lVar36 = CONCAT44(local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
          uVar41 = (ulong)((int)*(double *)(lVar36 + (long)puVar25 * 8) + 1);
          if (uVar41 < uVar16) {
            this_00 = (vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>
                       *)(local_190.
                          super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar41);
            local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = *(pointer *)(lVar36 + (long)puVar25 * 8);
            iVar6._M_current = *(pair<unsigned_long,_double> **)(this_00 + 8);
            if (iVar6._M_current == *(pair<unsigned_long,_double> **)(this_00 + 0x10)) {
              local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = puVar25;
              std::
              vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>
              ::_M_realloc_insert<std::pair<unsigned_long,double>>
                        (this_00,iVar6,(pair<unsigned_long,_double> *)&local_238);
            }
            else {
              (iVar6._M_current)->first = (unsigned_long)puVar25;
              (iVar6._M_current)->second =
                   (double)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
              local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = puVar25;
            }
            pppVar1 = &((local_190.
                         super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish + (long)local_1e0;
            *pppVar1 = *pppVar1 + -1;
            iVar22 = 0x19;
          }
          else {
            if ((local_1f8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[(long)puVar25] + local_158 <= local_240) {
              local_160 = lVar30;
              if (local_14c == 2) {
                local_1d8 = puVar25;
                local_40 = std::chrono::_V2::system_clock::now();
                iVar6._M_current = iStack_140._M_current;
                ppVar23 = local_148;
                uVar16 = (long)iStack_140._M_current - (long)local_148 >> 4;
                local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start = (uint *)0x0;
                local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = (uint *)0x0;
                local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
                lVar30 = (long)iStack_140._M_current - (long)local_148;
                if (iStack_140._M_current != local_148) {
                  pdVar18 = &local_148[uVar16 - 1].second;
                  uVar41 = uVar16;
                  do {
                    *pdVar18 = *(double *)
                                (CONCAT44(local_100.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start._4_4_,
                                          local_100.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                ((pair<unsigned_long,_double> *)(pdVar18 + -1))->first * 8);
                    pdVar18 = pdVar18 + -2;
                    uVar41 = uVar41 - 1;
                  } while (uVar41 != 0);
                }
                if (local_148 != iStack_140._M_current) {
                  lVar36 = 0x3f;
                  if (uVar16 != 0) {
                    for (; uVar16 >> lVar36 == 0; lVar36 = lVar36 + -1) {
                    }
                  }
                  std::
                  __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__1>>
                            (local_148,iStack_140._M_current,((uint)lVar36 ^ 0x3f) * 2 ^ 0x7e);
                  if (lVar30 < 0x101) {
                    std::
                    __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__1>>
                              (ppVar23,iVar6._M_current);
                  }
                  else {
                    ppVar31 = ppVar23 + 0x10;
                    std::
                    __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__1>>
                              (ppVar23,ppVar31);
                    if (ppVar31 != iVar6._M_current) {
                      pdVar18 = &ppVar23[0x10].second;
                      do {
                        dVar48 = (double)ppVar31->first;
                        dVar51 = ppVar31->second;
                        dVar47 = ppVar31[-1].second;
                        ppVar23 = ppVar31;
                        pdVar13 = pdVar18;
                        if (dVar51 < dVar47) {
                          do {
                            pdVar26 = pdVar13;
                            ((pair<unsigned_long,_double> *)(pdVar26 + -1))->first =
                                 (unsigned_long)pdVar26[-3];
                            *pdVar26 = dVar47;
                            dVar47 = pdVar26[-4];
                            pdVar13 = pdVar26 + -2;
                          } while (dVar51 < dVar47);
                          ppVar23 = (pair<unsigned_long,_double> *)(pdVar26 + -3);
                        }
                        ppVar23->first = (unsigned_long)dVar48;
                        ppVar23->second = dVar51;
                        ppVar31 = ppVar31 + 1;
                        pdVar18 = pdVar18 + 2;
                      } while (ppVar31 != iVar6._M_current);
                    }
                  }
                }
                uVar15 = (int)uVar16 - 1;
                bVar43 = true;
                if (local_178 <= local_240) {
                  local_218 = 0.0;
                  pvVar39 = (vector<unsigned_int,std::allocator<unsigned_int>> *)0xffffffffffffffff;
                  lVar30 = local_160;
                  do {
                    pvVar39 = pvVar39 + 1;
                    if (pvVar38 == pvVar39) break;
                    ppVar24 = (&((local_190.
                                  super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)[(long)local_1e0];
                    if (-1 < (int)uVar15) {
                      dVar51 = *(double *)((long)ppVar24 + lVar30 + -8);
                      dVar47 = local_148[uVar15].second;
                      pdVar5 = (local_1f8->super__Vector_base<double,_std::allocator<double>_>).
                               _M_impl.super__Vector_impl_data._M_start;
                      if (dVar47 <= dVar51) {
                        dVar47 = pdVar5[*(long *)((long)&ppVar24[-1].first + lVar30)];
                        if (local_218 + dVar47 <= local_240) {
                          local_244 = (uint)(long)(dVar51 * dVar47);
                          if (local_238.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish !=
                              local_238.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00106fe5;
                          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                          _M_realloc_insert<unsigned_int>
                                    (&local_238,
                                     (iterator)
                                     local_238.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,&local_244);
                          goto LAB_0010702d;
                        }
                        lVar30 = (long)((local_240 - local_218) * dVar51);
                        local_244 = (uint)lVar30;
                        if (local_238.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish !=
                            local_238.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage) goto LAB_00107a6e;
                        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                        _M_realloc_insert<unsigned_int>
                                  (&local_238,
                                   (iterator)
                                   local_238.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,&local_244);
                        lVar30 = extraout_RAX_04;
                      }
                      else {
                        dVar51 = pdVar5[local_148[uVar15].first];
                        if (local_218 + dVar51 <= local_240) {
                          local_244 = (uint)(long)(dVar47 * dVar51);
                          if (local_238.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish ==
                              local_238.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage) {
                            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                            _M_realloc_insert<unsigned_int>
                                      (&local_238,
                                       (iterator)
                                       local_238.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,&local_244);
                          }
                          else {
                            *local_238.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish = local_244;
                            local_238.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 local_238.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + 1;
                          }
                          pdVar18 = (local_1f8->super__Vector_base<double,_std::allocator<double>_>)
                                    ._M_impl.super__Vector_impl_data._M_start +
                                    local_148[uVar15].first;
                          uVar15 = uVar15 - 1;
                          goto LAB_0010704f;
                        }
                        lVar30 = (long)((local_240 - local_218) * dVar47);
                        local_244 = (uint)lVar30;
                        if (local_238.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish ==
                            local_238.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage) {
                          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                          _M_realloc_insert<unsigned_int>
                                    (&local_238,
                                     (iterator)
                                     local_238.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,&local_244);
                          lVar30 = extraout_RAX_03;
                        }
                        else {
LAB_00107a6e:
                          *local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish = (uint)lVar30;
                          local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish =
                               local_238.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 1;
                        }
                      }
LAB_00107a83:
                      local_1fc = (uint)CONCAT71((int7)((ulong)lVar30 >> 8),1);
                      bVar43 = false;
                      local_218 = local_240;
                      goto LAB_00107092;
                    }
                    dVar51 = (local_1f8->super__Vector_base<double,_std::allocator<double>_>).
                             _M_impl.super__Vector_impl_data._M_start
                             [*(long *)((long)&ppVar24[-1].first + lVar30)];
                    if (local_240 < local_218 + dVar51) {
                      lVar30 = (long)((local_240 - local_218) *
                                     *(double *)((long)ppVar24 + lVar30 + -8));
                      local_244 = (uint)lVar30;
                      if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish !=
                          local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00107a6e;
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                      _M_realloc_insert<unsigned_int>
                                (&local_238,
                                 (iterator)
                                 local_238.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,&local_244);
                      lVar30 = extraout_RAX_02;
                      goto LAB_00107a83;
                    }
                    local_244 = (uint)(long)(dVar51 * *(double *)((long)ppVar24 + lVar30 + -8));
                    if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                      _M_realloc_insert<unsigned_int>
                                (&local_238,
                                 (iterator)
                                 local_238.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,&local_244);
                    }
                    else {
LAB_00106fe5:
                      *local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish = local_244;
                      local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1;
                    }
LAB_0010702d:
                    pdVar18 = (local_1f8->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl.super__Vector_impl_data._M_start +
                              *(long *)((long)&(&((local_190.
                                                                                                      
                                                  super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)
                                               [(long)local_1e0][-1].first + lVar30);
LAB_0010704f:
                    lVar30 = lVar30 + -0x10;
                    local_218 = local_218 + *pdVar18;
                  } while (local_178 + local_218 <= local_240);
                }
                else {
                  local_218 = 0.0;
                }
                local_1fc = 0;
LAB_00107092:
                uVar16 = local_1e8;
                if (bVar43) {
                  do {
                    dVar51 = local_178 + local_218;
                    if ((local_240 < dVar51) || (uVar16 = uVar16 - 1, uVar16 == 0)) break;
                    ppVar24 = local_190.
                              super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar16].
                              super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    ppVar27 = local_190.
                              super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar16].
                              super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                    if (ppVar24 != ppVar27) {
                      uVar41 = (long)ppVar27 - (long)ppVar24 >> 4;
                      lVar30 = 0x3f;
                      if (uVar41 != 0) {
                        for (; uVar41 >> lVar30 == 0; lVar30 = lVar30 + -1) {
                        }
                      }
                      local_70 = dVar51;
                      std::
                      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__2>>
                                (ppVar24,ppVar27,((uint)lVar30 ^ 0x3f) * 2 ^ 0x7e);
                      if ((long)ppVar27 - (long)ppVar24 < 0x101) {
                        std::
                        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__2>>
                                  (ppVar24,ppVar27);
                        dVar51 = local_70;
                      }
                      else {
                        ppVar32 = ppVar24 + 0x10;
                        std::
                        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__2>>
                                  (ppVar24,ppVar32);
                        dVar51 = local_70;
                        if (ppVar32 != ppVar27) {
                          pdVar18 = &ppVar24[0x10].second;
                          do {
                            dVar7 = (double)ppVar32->first;
                            dVar47 = ppVar32->second;
                            dVar48 = ppVar32[-1].second;
                            ppVar24 = ppVar32;
                            pdVar13 = pdVar18;
                            if (dVar47 < dVar48) {
                              do {
                                pdVar26 = pdVar13;
                                ((pair<unsigned_long,_double> *)(pdVar26 + -1))->first =
                                     (unsigned_long)pdVar26[-3];
                                *pdVar26 = dVar48;
                                dVar48 = pdVar26[-4];
                                pdVar13 = pdVar26 + -2;
                              } while (dVar47 < dVar48);
                              ppVar24 = (pointer)(pdVar26 + -3);
                            }
                            ppVar24->first = (unsigned_long)dVar7;
                            ppVar24->second = dVar47;
                            ppVar32 = ppVar32 + 1;
                            pdVar18 = pdVar18 + 2;
                          } while (ppVar32 != ppVar27);
                        }
                      }
                    }
                    if (dVar51 <= local_240) {
                      lVar30 = (long)local_190.
                                     super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar16].
                                     super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_190.
                                     super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar16].
                                     super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                      lVar36 = (lVar30 >> 4) + 1;
                      do {
                        lVar36 = lVar36 + -1;
                        if (lVar36 == 0) break;
                        ppVar24 = local_190.
                                  super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar16].
                                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        if (-1 < (int)uVar15) {
                          dVar51 = *(double *)((long)ppVar24 + lVar30 + -8);
                          dVar47 = local_148[uVar15].second;
                          pdVar5 = (local_1f8->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_start;
                          if (dVar47 <= dVar51) {
                            dVar47 = pdVar5[*(long *)((long)&ppVar24[-1].first + lVar30)];
                            if (local_218 + dVar47 <= local_240) {
                              local_244 = (uint)(long)(dVar51 * dVar47);
                              if (local_238.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish !=
                                  local_238.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                              goto LAB_001072fe;
                              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                              _M_realloc_insert<unsigned_int>
                                        (&local_238,
                                         (iterator)
                                         local_238.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,&local_244);
                              goto LAB_00107346;
                            }
                            lVar30 = (long)((local_240 - local_218) * dVar51);
                            local_244 = (uint)lVar30;
                            if (local_238.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish !=
                                local_238.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage)
                            goto LAB_00107446;
                            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                            _M_realloc_insert<unsigned_int>
                                      (&local_238,
                                       (iterator)
                                       local_238.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,&local_244);
                            lVar30 = extraout_RAX_01;
                          }
                          else {
                            dVar51 = pdVar5[local_148[uVar15].first];
                            if (local_218 + dVar51 <= local_240) {
                              local_244 = (uint)(long)(dVar47 * dVar51);
                              if (local_238.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish ==
                                  local_238.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                                _M_realloc_insert<unsigned_int>
                                          (&local_238,
                                           (iterator)
                                           local_238.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_finish,&local_244);
                              }
                              else {
                                *local_238.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish = local_244;
                                local_238.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish =
                                     local_238.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 1;
                              }
                              pdVar18 = (local_1f8->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data._M_start + local_148[uVar15].first;
                              uVar15 = uVar15 - 1;
                              goto LAB_00107363;
                            }
                            lVar30 = (long)((local_240 - local_218) * dVar47);
                            local_244 = (uint)lVar30;
                            if (local_238.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish ==
                                local_238.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage) {
                              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                              _M_realloc_insert<unsigned_int>
                                        (&local_238,
                                         (iterator)
                                         local_238.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,&local_244);
                              lVar30 = extraout_RAX_00;
                            }
                            else {
LAB_00107446:
                              *local_238.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish = (uint)lVar30;
                              local_238.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish =
                                   local_238.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish + 1;
                            }
                          }
LAB_00107456:
                          local_1fc = (uint)CONCAT71((int7)((ulong)lVar30 >> 8),1);
                          local_218 = local_240;
                          break;
                        }
                        dVar51 = (local_1f8->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data._M_start
                                 [*(long *)((long)&ppVar24[-1].first + lVar30)];
                        if (local_240 < local_218 + dVar51) {
                          lVar30 = (long)((local_240 - local_218) *
                                         *(double *)((long)ppVar24 + lVar30 + -8));
                          local_244 = (uint)lVar30;
                          if (local_238.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish !=
                              local_238.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00107446;
                          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                          _M_realloc_insert<unsigned_int>
                                    (&local_238,
                                     (iterator)
                                     local_238.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,&local_244);
                          lVar30 = extraout_RAX;
                          goto LAB_00107456;
                        }
                        local_244 = (uint)(long)(dVar51 * *(double *)((long)ppVar24 + lVar30 + -8));
                        if (local_238.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish ==
                            local_238.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage) {
                          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                          _M_realloc_insert<unsigned_int>
                                    (&local_238,
                                     (iterator)
                                     local_238.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,&local_244);
                        }
                        else {
LAB_001072fe:
                          *local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish = local_244;
                          local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish =
                               local_238.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 1;
                        }
LAB_00107346:
                        pdVar18 = (local_1f8->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_start +
                                  *(long *)((long)&local_190.
                                                                                                      
                                                  super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar16].
                                                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[-1].
                                                  first + lVar30);
LAB_00107363:
                        lVar30 = lVar30 + -0x10;
                        local_218 = local_218 + *pdVar18;
                      } while (local_178 + local_218 <= local_240);
                    }
                  } while ((local_1fc & 1) == 0);
                }
                puVar25 = local_1d8;
                puVar12 = local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
                puVar19 = local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start !=
                    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  uVar16 = (long)local_238.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_238.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 2;
                  lVar30 = 0x3f;
                  if (uVar16 != 0) {
                    for (; uVar16 >> lVar30 == 0; lVar30 = lVar30 + -1) {
                    }
                  }
                  std::
                  __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                            (local_238.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start,
                             local_238.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish,((uint)lVar30 ^ 0x3f) * 2 ^ 0x7e);
                  std::
                  __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                            (puVar19,puVar12);
                }
                pAVar42 = local_1f0;
                uVar16 = (long)local_238.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_238.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2;
                if ((1 < uVar16) && (1 < uVar16 + 1)) {
                  uVar41 = uVar16 + 1 >> 1;
                  do {
                    uVar34 = uVar41 - 1;
                    uVar15 = local_238.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar41 - 1];
                    uVar33 = uVar41 * 2 - 1;
                    uVar35 = uVar34;
                    if (uVar33 < uVar16) {
                      lVar30 = uVar41 * 2 + -2;
                      do {
                        if ((lVar30 + 2U == uVar16) ||
                           (uVar41 = lVar30 + 2U,
                           local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar33] <
                           local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar30 + 2])) {
                          uVar41 = uVar33;
                        }
                        if (uVar15 <= local_238.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar41]) break;
                        local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar35] =
                             local_238.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar41];
                        lVar30 = uVar41 * 2;
                        uVar33 = uVar41 * 2 + 1;
                        uVar35 = uVar41;
                      } while (uVar33 < uVar16);
                    }
                    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar35] = uVar15;
                    uVar41 = uVar34;
                  } while (uVar34 != 0);
                }
                lVar30 = 0;
                for (puVar19 = local_238.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                    puVar19 !=
                    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish; puVar19 = puVar19 + 1) {
                  lVar30 = lVar30 + (ulong)*puVar19;
                }
                lVar30 = lVar30 + local_198;
                auVar45._8_4_ = (int)((ulong)lVar30 >> 0x20);
                auVar45._0_8_ = lVar30;
                auVar45._12_4_ = 0x45300000;
                sVar2 = local_1f0->__numRRsets;
                auVar50._8_4_ = (int)(sVar2 >> 0x20);
                auVar50._0_8_ = sVar2;
                auVar50._12_4_ = 0x45300000;
                dVar51 = ((double)local_1f0->__numV *
                         ((auVar45._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar30) - 4503599627370496.0))) /
                         ((auVar50._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
                local_1f0->__boundLast_inf_cost = dVar51;
                if (dVar51 < local_1f0->__boundMin_inf_cost) {
                  local_1f0->__boundMin_inf_cost = dVar51;
                }
                lVar30 = std::chrono::_V2::system_clock::now();
                *local_48 = (double)(lVar30 - local_40) / 1000000000.0 + *local_48;
                if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start != (uint *)0x0) {
                  operator_delete(local_238.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_238.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_238.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
              }
              auVar46._0_8_ = (double)CONCAT44(0x43300000,(int)local_198);
              auVar46._8_4_ = (int)(local_198 >> 0x20);
              auVar46._12_4_ = 0x45300000;
              local_218 = *(double *)
                           (CONCAT44(local_100.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_100.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_4_) +
                           (long)puVar25 * 8) *
                          (local_1f8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[(long)puVar25] +
                          (auVar46._8_8_ - 1.9342813113834067e+25) +
                          (auVar46._0_8_ - 4503599627370496.0);
              uStack_210 = 0;
              local_1d8 = (uint *)(local_218 - 9.223372036854776e+18);
              uStack_1d0 = 0;
              local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(local_238.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,(uint)puVar25);
              iVar3._M_current =
                   (pAVar42->__vecSeed_inf_cost).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (pAVar42->__vecSeed_inf_cost).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>(local_50,iVar3,(uint *)&local_238);
              }
              else {
                *iVar3._M_current = (uint)puVar25;
                (pAVar42->__vecSeed_inf_cost).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
              pdVar5 = (local_1f8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              local_158 = local_158 + pdVar5[(long)puVar25];
              lVar30 = CONCAT44(local_100.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_100.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_4_);
              *(undefined8 *)(lVar30 + (long)puVar25 * 8) = 0;
              puVar20 = (uint *)((long)puVar25 + 0x3f);
              if (-1 < (long)puVar25) {
                puVar20 = puVar25;
              }
              local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p
              [((long)puVar20 >> 6) +
               ((ulong)(((ulong)puVar25 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
                   local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [((long)puVar20 >> 6) +
                    ((ulong)(((ulong)puVar25 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                   1L << ((byte)puVar25 & 0x3f);
              local_178 = min_vector_nonzero_mask(local_1f8,&local_128);
              uVar16 = local_1e8;
              pvVar8 = (pAVar42->__hyperG)._FRsets.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar21 = pvVar8[(long)puVar25].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              puVar9 = *(pointer *)
                        ((long)&pvVar8[(long)puVar25].
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data + 8);
              if (puVar21 != puVar9) {
                pvVar10 = (local_1f0->__hyperG)._RRsets.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  uVar41 = *puVar21;
                  uVar33 = uVar41 + 0x3f;
                  if (-1 < (long)uVar41) {
                    uVar33 = uVar41;
                  }
                  uVar35 = (ulong)((uVar41 & 0x800000000000003f) < 0x8000000000000001);
                  if ((*(ulong *)((long)local_1c8 + (((long)uVar33 >> 6) + (uVar35 - 1)) * 8) >>
                       (uVar41 & 0x3f) & 1) == 0) {
                    *(ulong *)((long)local_1c8 + (((long)uVar33 >> 6) + (uVar35 - 1)) * 8) =
                         *(ulong *)((long)local_1c8 + (((long)uVar33 >> 6) + (uVar35 - 1)) * 8) |
                         1L << ((byte)uVar41 & 0x3f);
                    puVar20 = *(pointer *)
                               ((long)&pvVar10[uVar41].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data + 8);
                    for (puVar25 = pvVar10[uVar41].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start; puVar25 != puVar20;
                        puVar25 = puVar25 + 1) {
                      uVar41 = (ulong)*puVar25;
                      dVar51 = *(double *)(lVar30 + uVar41 * 8);
                      if ((dVar51 != 0.0) || (NAN(dVar51))) {
                        dVar47 = pdVar5[uVar41];
                        *(double *)(lVar30 + uVar41 * 8) = (dVar51 * dVar47 + -1.0) / dVar47;
                      }
                    }
                  }
                  puVar21 = puVar21 + 1;
                } while (puVar21 != puVar9);
              }
              local_198 = (long)(double)local_1d8 & (long)local_218 >> 0x3f | (long)local_218;
              pppVar1 = &((local_190.
                           super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + (long)local_1e0;
              ppVar24 = pppVar1[1] + -1;
              pppVar1[1] = ppVar24;
              uVar41 = local_1e8;
              do {
                ppVar27 = local_190.
                          super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar41].
                          super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                lVar36 = (long)ppVar27 -
                         (long)local_190.
                               super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar41].
                               super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                if (lVar36 != 0) {
                  lVar36 = lVar36 >> 4;
                  pdVar18 = &ppVar27[-1].second;
                  do {
                    *pdVar18 = *(double *)
                                (lVar30 + ((pair<unsigned_long,_double> *)(pdVar18 + -1))->first * 8
                                );
                    pdVar18 = pdVar18 + -2;
                    lVar36 = lVar36 + -1;
                  } while (lVar36 != 0);
                }
                uVar41 = uVar41 - 1;
              } while (uVar41 != 0);
              ppVar27 = *pppVar1;
              lVar30 = local_160;
              pAVar42 = local_1f0;
              if (ppVar27 != ppVar24) {
                uVar41 = (long)ppVar24 - (long)ppVar27 >> 4;
                lVar30 = 0x3f;
                if (uVar41 != 0) {
                  for (; uVar41 >> lVar30 == 0; lVar30 = lVar30 + -1) {
                  }
                }
                std::
                __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__3>>
                          (ppVar27,ppVar24,((uint)lVar30 ^ 0x3f) * 2 ^ 0x7e);
                if ((long)ppVar24 - (long)ppVar27 < 0x101) {
                  std::
                  __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__3>>
                            (ppVar27,ppVar24);
                  lVar30 = local_160;
                  pAVar42 = local_1f0;
                }
                else {
                  ppVar32 = ppVar27 + 0x10;
                  std::
                  __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__3>>
                            (ppVar27,ppVar32);
                  lVar30 = local_160;
                  uVar16 = local_1e8;
                  pAVar42 = local_1f0;
                  if (ppVar32 != ppVar24) {
                    pdVar18 = &ppVar27[0x10].second;
                    do {
                      dVar48 = (double)ppVar32->first;
                      dVar51 = ppVar32->second;
                      dVar47 = ppVar32[-1].second;
                      ppVar27 = ppVar32;
                      pdVar13 = pdVar18;
                      if (dVar51 < dVar47) {
                        do {
                          pdVar26 = pdVar13;
                          ((pair<unsigned_long,_double> *)(pdVar26 + -1))->first =
                               (unsigned_long)pdVar26[-3];
                          *pdVar26 = dVar47;
                          dVar47 = pdVar26[-4];
                          pdVar13 = pdVar26 + -2;
                        } while (dVar51 < dVar47);
                        ppVar27 = (pointer)(pdVar26 + -3);
                      }
                      ppVar27->first = (unsigned_long)dVar48;
                      ppVar27->second = dVar51;
                      ppVar32 = ppVar32 + 1;
                      pdVar18 = pdVar18 + 2;
                    } while (ppVar32 != ppVar24);
                  }
                }
              }
            }
            else {
              local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = *(pointer *)(lVar36 + (long)puVar25 * 8);
              if (iStack_140._M_current == local_138) {
                local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start = puVar25;
                std::
                vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>
                ::_M_realloc_insert<std::pair<unsigned_long,double>>
                          ((vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>
                            *)&local_148,iStack_140,(pair<unsigned_long,_double> *)&local_238);
              }
              else {
                (iStack_140._M_current)->first = (unsigned_long)puVar25;
                (iStack_140._M_current)->second =
                     (double)local_238.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish;
                iStack_140._M_current = iStack_140._M_current + 1;
                local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start = puVar25;
              }
              pppVar1 = &((local_190.
                           super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish + (long)local_1e0;
              *pppVar1 = *pppVar1 + -1;
            }
            iVar22 = 0;
            if (local_240 < local_158 + local_178) {
              iVar22 = 0x18;
            }
          }
        } while (((iVar22 == 0x19) || (iVar22 == 0)) &&
                (lVar30 = lVar30 + -0x10, pvVar38 = local_c0,
                local_c0 != (vector<unsigned_int,std::allocator<unsigned_int>> *)0x0));
      }
      ppVar24 = local_190.
                super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].
                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar14 = local_190.
                super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1;
      if (ppVar24 != (pointer)0x0) {
        pvVar14 = local_190.
                  super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1;
        local_190.
        super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_190.
             super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
        operator_delete(ppVar24,(long)(pvVar14->
                                      super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                      )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)ppVar24);
        pvVar14 = local_190.
                  super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      local_190.
      super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pvVar14;
      uVar41 = uVar16 - 1;
    } while ((uVar41 != 0) && (local_158 + local_178 <= local_240));
  }
  uVar15 = pAVar42->__numV;
  local_218 = (double)pAVar42->__numRRsets;
  uStack_210 = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  >>>[greedy-lazy] influence_cost: ",0x23);
  poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
  local_218 = ((double)uVar15 *
              (((double)CONCAT44(0x45300000,(int)(local_198 >> 0x20)) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_198) - 4503599627370496.0))) /
              (((double)CONCAT44(0x45300000,local_218._4_4_) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(undefined4)local_218) - 4503599627370496.0));
  poVar17 = std::ostream::_M_insert<double>(local_218);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,", min-bound_cost: ",0x12);
  poVar17 = std::ostream::_M_insert<double>(pAVar42->__boundMin_inf_cost);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,", last-bound_cost: ",0x13);
  poVar17 = std::ostream::_M_insert<double>(pAVar42->__boundLast_inf_cost);
  local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,(char *)&local_238,1);
  bVar43 = local_78 <= local_218;
  if (bVar43) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pAVar42->__vecSeed,
               (pAVar42->__vecSeed_inf_cost).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (pAVar42->__vecSeed_inf_cost).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cost Inf: ",10);
    poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
  }
  else {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pAVar42->__vecSeed,
               (pAVar42->__vecSeed_inf).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (pAVar42->__vecSeed_inf).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Inf: ",5);
    poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    local_218 = local_78;
  }
  pAVar42->__is_inf_cost = bVar43;
  if (local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_1c8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1c8,(long)local_1a8 - (long)local_1c8);
    local_1c8 = (undefined1  [8])0x0;
    p_Stack_1c0 = (_Bit_type *)((ulong)p_Stack_1c0 & 0xffffffff00000000);
    local_1b8 = (_Bit_type *)0x0;
    local_1b0 = 0;
    local_1a8 = (_Bit_pointer)0x0;
  }
  if (local_148 != (pair<unsigned_long,_double> *)0x0) {
    operator_delete(local_148,(long)local_138 - (long)local_148);
  }
  std::
  vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
  ::~vector(&local_190);
  pvVar11 = (void *)CONCAT44(local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start._0_4_);
  if (pvVar11 != (void *)0x0) {
    operator_delete(pvVar11,(long)local_100.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar11)
    ;
  }
  if (local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_68);
  if (local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_218;
}

Assistant:

double Alg::max_cover_lazy_budget(const Graph & graph, const double budget,
        const std::vector<double> & budget_list, double & timeb, const int mode) {
    // mode: optimization mode.
    // 0->no optimization,
    // 1->optimization with the upper bound in the last round,
    // 2->optimization with minimum upper bound among all rounds [Default].
    const double EPS = 0.0000000001;
    __boundLast = DBL_MAX, __boundMin = DBL_MAX;
    __boundLast_inf = DBL_MAX, __boundMin_inf = DBL_MAX;
    __boundLast_inf_cost = DBL_MAX, __boundMin_inf_cost = DBL_MAX;
    FRset coverage(__numV, 0);
    size_t maxDeg = 0;
    for (auto i = __numV; i--;) {
        const size_t deg = __hyperG._FRsets[i].size();
        coverage[i] = deg;
        if (deg > maxDeg) {
            maxDeg = deg;
        }
    }
    RRsets degMap(maxDeg + 1); // degMap: map degree to the nodes with this degree
    for (auto i = __numV; i--;) {
        if (coverage[i] == 0) {
            continue;
        }
        degMap[coverage[i]].push_back(i);
    }

    size_t sumInf = 0;
    int flag = 0;
    // check if an edge is removed
    std::vector<bool> edgeMark(__numRRsets, false);
    // check if an edge is removed
    std::vector<bool> node_sel(__numV, false);
    double min_cost = min_vector_nonzero_mask(budget_list, node_sel);
    std::cout << "min_cost: " << min_cost << std::endl;

    __vecSeed_inf.clear();
    for (size_t deg = maxDeg; deg > 0; deg--) // Enusre deg > 0
    {
        if (min_cost > budget) {
            break;
        }
        auto & vecNode = degMap[deg];
        for (auto idx = vecNode.size(); idx--;) {
            auto argmaxIdx = vecNode[idx];
            const auto currDeg = coverage[argmaxIdx];
            if (deg > currDeg)
            {
                degMap[currDeg].push_back(argmaxIdx);
                continue;
            }
            if (budget_list[argmaxIdx] <= budget) {
                if (mode == 2) {
                    // Find upper bound
                    auto degBound = deg;
                    Nodelist vecBound;
                    // Initialize vecBound
                    auto idxBound = idx;
                    vecBound.push_back(coverage[degMap[degBound][idxBound]]);
                    __boundLast_inf = double(accumulate(vecBound.begin(), vecBound.end(), size_t(0))
                                             + sumInf) * __numV /__numRRsets;
                    if (__boundMin_inf > __boundLast_inf) {
                        __boundMin_inf = __boundLast_inf;
                    }
                }
                if (flag == 0) {
                    sumInf = sumInf + coverage[argmaxIdx];
                    __vecSeed_inf.push_back(argmaxIdx);
                    coverage[argmaxIdx] = 0;
                    for (auto edgeIdx : __hyperG._FRsets[argmaxIdx])
                    {
                        if (edgeMark[edgeIdx]) continue;
                        edgeMark[edgeIdx] = true;
                        for (auto nodeIdx : __hyperG._RRsets[edgeIdx])
                        {
                            if (coverage[nodeIdx] == 0) continue; // This node is seed, skip
                            coverage[nodeIdx]--;
                        }
                    }
                }
                flag = flag + 1;
            }
            if (flag == 2) {
                break;
            }
        }
        if (flag == 2) {
            break;
        }
        degMap.pop_back();
    }
    // Top-k influential nodes constructed
    const auto finalInf = 1.0 * sumInf * __numV / __numRRsets;
    std::cout << std::endl;
    std::cout << "  >>>[greedy-lazy] influence: " << sumInf << " " << finalInf <<
              ", min-bound: " << __boundMin_inf <<
              ", last-bound: " << __boundLast_inf << '\n';

    // cost influence most
    std::vector<double> coverage_cost(__numV, 0);
    size_t maxDeg_cost = 0;
    for (auto i = __numV; i--;) {
        const size_t deg_cost = __hyperG._FRsets[i].size();
        if (fabs(budget_list[i]) <= EPS || deg_cost == 0) {
            coverage_cost[i] = 0;
        }
        else {
            coverage_cost[i] = (double) deg_cost / budget_list[i];
        }
    }

    // Normalization
    for (auto i = __numV; i--;) {
        if (int(coverage_cost[i]) + 1 > maxDeg_cost) {
            maxDeg_cost = int(coverage_cost[i]) + 1;
        }
    }
    std::cout << "maxDeg: " << maxDeg_cost << std::endl;

    // int(u.inf/u.cost) -> sort(pair<u.id, u.inf/u.cost>)
    std::vector<std::vector<std::pair<size_t, double>>> degMap_cost(maxDeg_cost + 1);
    for (auto i = __numV; i--;) {
        if (fabs(coverage_cost[i]) <= EPS) {
            continue;
        }
        degMap_cost[int(coverage_cost[i]) + 1].push_back(std::make_pair(i, coverage_cost[i]));
    }

    size_t sumInf_cost = 0;
    double sumBudget_cost = 0;
    // label miss nodes
    std::vector<std::pair<size_t, double>> miss_nodes_vec;
    // check if an edge is removed
    std::vector<bool> edgeMark_cost(__numRRsets, false);
    std::vector<bool> node_sel_cost(__numV, false);
    min_cost = min_vector_nonzero_mask(budget_list, node_sel_cost);

    Timer timerBound("Bound");
    __vecSeed_inf_cost.clear();
    for (size_t deg = maxDeg_cost; deg > 0; deg--) // Enusre deg > 0
    {
        if (sumBudget_cost + min_cost > budget) {
            break;
        }
        std::sort(degMap_cost[deg].begin(), degMap_cost[deg].end(), [](auto & left, auto & right) {
            return std::get<1>(left) < std::get<1>(right);
        });
        auto & vecNode = degMap_cost[deg];
        for (auto idx = vecNode.size(); idx--;) {
            auto argmaxIdx = std::get<0>(vecNode[idx]);
            const size_t currDeg = int(coverage_cost[argmaxIdx]) + 1;
            if (deg > currDeg) {
                degMap_cost[currDeg].push_back(std::make_pair(argmaxIdx, coverage_cost[argmaxIdx]));
                degMap_cost[deg].pop_back();
                continue;
            }
            if (sumBudget_cost + budget_list[argmaxIdx] <= budget) {
                if (mode == 2) {
                    timerBound.get_operation_time();
                    // Find upper bound
                    auto degBound = deg;
                    Nodelist vecBound;
                    double vecBound_Budget = 0;
                    // Initialize vecBound
                    auto idxBound = idx + 1;
                    int miss_idxBound = miss_nodes_vec.size() - 1;
                    bool is_stop = false;
                    for (size_t miss_idx = miss_nodes_vec.size(); miss_idx--; ) {
                        std::get<1>(miss_nodes_vec[miss_idx]) = coverage_cost[std::get<0>(miss_nodes_vec[miss_idx])];
                    }
                    std::sort(miss_nodes_vec.begin(), miss_nodes_vec.end(), [](auto & left, auto & right) {
                        return std::get<1>(left) < std::get<1>(right);
                    });
                    if (is_stop == false) {
                        while (vecBound_Budget + min_cost <= budget && idxBound--) {
                            if (miss_idxBound >= 0) {
                                if (std::get<1>(degMap_cost[degBound][idxBound]) >= std::get<1>(miss_nodes_vec[miss_idxBound])) {
                                    if (vecBound_Budget + budget_list[std::get<0>(degMap_cost[degBound][idxBound])] <= budget) {
                                        vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                           budget_list[std::get<0>(degMap_cost[degBound][idxBound])]);
                                        vecBound_Budget += budget_list[std::get<0>(degMap_cost[degBound][idxBound])];
                                    }
                                    else {
                                        vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                           (budget - vecBound_Budget));
                                        vecBound_Budget = budget;
                                        is_stop = true;
                                        break;
                                    }
                                }
                                else {
                                    if (vecBound_Budget + budget_list[std::get<0>(miss_nodes_vec[miss_idxBound])] <= budget) {
                                        vecBound.push_back(std::get<1>(miss_nodes_vec[miss_idxBound]) *
                                                           budget_list[std::get<0>(miss_nodes_vec[miss_idxBound])]);
                                        vecBound_Budget += budget_list[std::get<0>(miss_nodes_vec[miss_idxBound])];
                                        miss_idxBound = miss_idxBound - 1;
                                    }
                                    else {
                                        vecBound.push_back(std::get<1>(miss_nodes_vec[miss_idxBound]) *
                                                           (budget - vecBound_Budget));
                                        vecBound_Budget = budget;
                                        is_stop = true;
                                        break;
                                    }
                                }
                            }
                            else {
                                if (vecBound_Budget + budget_list[std::get<0>(degMap_cost[degBound][idxBound])] <= budget) {
                                    vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                       budget_list[std::get<0>(degMap_cost[degBound][idxBound])]);
                                    vecBound_Budget += budget_list[std::get<0>(degMap_cost[degBound][idxBound])];
                                }
                                else {
                                    vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                       (budget - vecBound_Budget));
                                    vecBound_Budget = budget;
                                    is_stop = true;
                                    break;
                                }
                            }
                        }
                    }
                    if (is_stop == false) {
                        while (vecBound_Budget + min_cost <= budget && --degBound) {
                            std::sort(degMap_cost[degBound].begin(), degMap_cost[degBound].end(), [](auto & left, auto & right) {
                                return std::get<1>(left) < std::get<1>(right);
                            });
                            idxBound = degMap_cost[degBound].size();
                            while (vecBound_Budget + min_cost <= budget && idxBound--) {
                                if (miss_idxBound >= 0) {
                                    if (std::get<1>(degMap_cost[degBound][idxBound]) >= std::get<1>(miss_nodes_vec[miss_idxBound])) {
                                        if (vecBound_Budget + budget_list[std::get<0>(degMap_cost[degBound][idxBound])] <= budget) {
                                            vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                               budget_list[std::get<0>(degMap_cost[degBound][idxBound])]);
                                            vecBound_Budget += budget_list[std::get<0>(degMap_cost[degBound][idxBound])];
                                        }
                                        else {
                                            vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                               (budget - vecBound_Budget));
                                            vecBound_Budget = budget;
                                            is_stop = true;
                                            break;
                                        }
                                    }
                                    else {
                                        if (vecBound_Budget + budget_list[std::get<0>(miss_nodes_vec[miss_idxBound])] <= budget) {
                                            vecBound.push_back(std::get<1>(miss_nodes_vec[miss_idxBound]) *
                                                               budget_list[std::get<0>(miss_nodes_vec[miss_idxBound])]);
                                            vecBound_Budget += budget_list[std::get<0>(miss_nodes_vec[miss_idxBound])];
                                            miss_idxBound = miss_idxBound - 1;
                                        }
                                        else {
                                            vecBound.push_back(std::get<1>(miss_nodes_vec[miss_idxBound]) *
                                                               (budget - vecBound_Budget));
                                            vecBound_Budget = budget;
                                            is_stop = true;
                                            break;
                                        }
                                    }
                                }
                                else {
                                    if (vecBound_Budget + budget_list[std::get<0>(degMap_cost[degBound][idxBound])] <= budget) {
                                        vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                           budget_list[std::get<0>(degMap_cost[degBound][idxBound])]);
                                        vecBound_Budget += budget_list[std::get<0>(degMap_cost[degBound][idxBound])];
                                    }
                                    else {
                                        vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                           (budget - vecBound_Budget));
                                        vecBound_Budget = budget;
                                        is_stop = true;
                                        break;
                                    }
                                }
                            }
                            if (is_stop == true) {
                                break;
                            }
                        }
                    }
                    std::sort(vecBound.begin(), vecBound.end());
                    make_min_heap(vecBound);

                    __boundLast_inf_cost = double(accumulate(vecBound.begin(), vecBound.end(), size_t(0))
                                                  + sumInf_cost) * __numV /__numRRsets;
                    if (__boundMin_inf_cost > __boundLast_inf_cost) {
                        __boundMin_inf_cost = __boundLast_inf_cost;
                    }
                    timeb += timerBound.get_operation_time();
                }
                sumInf_cost = sumInf_cost + coverage_cost[argmaxIdx] * budget_list[argmaxIdx];
                __vecSeed_inf_cost.push_back(argmaxIdx);
                sumBudget_cost = sumBudget_cost + budget_list[argmaxIdx];
                coverage_cost[argmaxIdx] = 0;
                node_sel_cost[argmaxIdx] = true;
                min_cost = min_vector_nonzero_mask(budget_list, node_sel_cost);
                for (auto edgeIdx : __hyperG._FRsets[argmaxIdx]) {
                    if (edgeMark_cost[edgeIdx]) {
                        continue;
                    }
                    edgeMark_cost[edgeIdx] = true;
                    for (auto nodeIdx : __hyperG._RRsets[edgeIdx]) {
                        if (coverage_cost[nodeIdx] == 0) {
                            continue; // This node is seed, skip
                        }
                        coverage_cost[nodeIdx] = (double) (coverage_cost[nodeIdx] * budget_list[nodeIdx] - 1) /
                                                 budget_list[nodeIdx];
                    }
                }
                degMap_cost[deg].pop_back();
                for (auto degup = deg; degup > 0; degup--) {
                    auto & vecNodeup = degMap_cost[degup];
                    for(auto idxup = vecNodeup.size(); idxup--;) {
                        std::get<1>(degMap_cost[degup][idxup]) = coverage_cost[std::get<0>(degMap_cost[degup][idxup])];
                    }
                }
                std::sort(degMap_cost[deg].begin(), degMap_cost[deg].end(), [](auto & left, auto & right) {
                    return std::get<1>(left) < std::get<1>(right);
                });
            }
            else{
                miss_nodes_vec.push_back(std::make_pair(argmaxIdx, coverage_cost[argmaxIdx]));
                degMap_cost[deg].pop_back();
            }
            if (sumBudget_cost + min_cost > budget) {
                break;
            }
        }
        degMap_cost.pop_back();
    }
    const auto finalInf_cost = 1.0 * sumInf_cost * __numV / __numRRsets;
    std::cout << "  >>>[greedy-lazy] influence_cost: " << sumInf_cost << " " <<
              finalInf_cost << ", min-bound_cost: " <<
              __boundMin_inf_cost << ", last-bound_cost: " << __boundLast_inf_cost << '\n';

    if (finalInf > finalInf_cost) {
        __vecSeed.assign(__vecSeed_inf.begin(), __vecSeed_inf.end());
        std::cout << "Inf: " <<  __vecSeed.size() << std::endl;
        __is_inf_cost = false;
        return finalInf;
    }
    else {
        __vecSeed.assign(__vecSeed_inf_cost.begin(), __vecSeed_inf_cost.end());
        std::cout << "Cost Inf: " << __vecSeed.size() << std::endl;
        __is_inf_cost = true;
        return finalInf_cost;
    }
}